

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

double dist(Vector3d a,Vector3d b)

{
  double *pdVar1;
  __type _Var2;
  __type _Var3;
  __type _Var4;
  double dVar5;
  double Z2;
  double Y2;
  double X2;
  Vector3d b_local;
  Vector3d a_local;
  
  b_local._0_8_ = b.data;
  X2 = b._0_8_;
  b_local.data = a._0_8_;
  pdVar1 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&b_local.data,0,0);
  dVar5 = *pdVar1;
  pdVar1 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&X2,0,0);
  _Var2 = std::pow<double,int>(dVar5 - *pdVar1,2);
  pdVar1 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&b_local.data,1,0);
  dVar5 = *pdVar1;
  pdVar1 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&X2,1,0);
  _Var3 = std::pow<double,int>(dVar5 - *pdVar1,2);
  pdVar1 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&b_local.data,2,0);
  dVar5 = *pdVar1;
  pdVar1 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&X2,2,0);
  _Var4 = std::pow<double,int>(dVar5 - *pdVar1,2);
  dVar5 = sqrt(_Var2 + _Var3 + _Var4);
  return dVar5;
}

Assistant:

double dist(const Vector3d a, const Vector3d b)
{
    double X2 = pow((a(0, 0) - b(0, 0)), 2);
    double Y2 = pow((a(1, 0) - b(1, 0)), 2);
    double Z2 = pow((a(2, 0) - b(2, 0)), 2);
    return (sqrt(X2 + Y2 + Z2));
}